

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceMesh::computeVertexNormals(SurfaceMesh *this)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *pvVar4;
  pointer pvVar5;
  size_t sVar6;
  pointer pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t iV;
  ulong uVar11;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  vec<3,_float,_(glm::qualifier)0> vVar13;
  vec<3,_float,_(glm::qualifier)0> local_40;
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->faceNormals);
  render::ManagedBuffer<float>::ensureHostBufferPopulated(&this->faceAreas);
  pvVar4 = (this->vertexNormals).data;
  sVar6 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    (&this->vertexPositions);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(pvVar4,sVar6);
  pvVar4 = (this->vertexNormals).data;
  pvVar5 = (pvVar4->
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar7 = (pvVar4->
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar5; pvVar7 = pvVar7 + 1) {
    pvVar7->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    pvVar7->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    (pvVar7->field_2).z = 0.0;
  }
  uVar11 = 0;
  while (uVar8 = uVar11,
        lVar10 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428,
        uVar8 < (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 -
                 lVar10 >> 2) - 1U) {
    uVar2 = *(uint *)(lVar10 + 4 + uVar8 * 4);
    for (uVar9 = (ulong)*(uint *)(lVar10 + uVar8 * 4); uVar11 = uVar8 + 1, uVar2 != uVar9;
        uVar9 = uVar9 + 1) {
      uVar3 = *(uint *)(*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).
                                  field_0x440 + uVar9 * 4);
      auVar12 = (undefined1  [56])0x0;
      vVar13 = glm::operator*((((this->faceNormals).data)->
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar8,
                              (((this->faceAreas).data)->
                              super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar8]);
      local_40.field_2 = vVar13.field_2;
      in_ZMM0._0_8_ = vVar13._0_8_;
      in_ZMM0._8_56_ = auVar12;
      local_40._0_8_ = vmovlps_avx(in_ZMM0._0_16_);
      glm::vec<3,float,(glm::qualifier)0>::operator+=
                ((vec<3,float,(glm::qualifier)0> *)
                 ((((this->vertexNormals).data)->
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar3),&local_40);
    }
  }
  lVar10 = 0;
  uVar11 = 0;
  while( true ) {
    auVar12 = in_ZMM0._8_56_;
    sVar6 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                      (&this->vertexPositions);
    if (sVar6 <= uVar11) break;
    vVar13 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                       ((vec<3,_float,_(glm::qualifier)0> *)
                        ((long)&((((this->vertexNormals).data)->
                                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    in_ZMM0._0_8_ = vVar13._0_8_;
    in_ZMM0._8_56_ = auVar12;
    uVar11 = uVar11 + 1;
    pvVar7 = (((this->vertexNormals).data)->
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = vmovlps_avx(in_ZMM0._0_16_);
    *(undefined8 *)((long)&pvVar7->field_0 + lVar10) = uVar1;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
     ((long)&pvVar7->field_2 + lVar10) = vVar13.field_2;
    lVar10 = lVar10 + 0xc;
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (&this->vertexNormals);
  return;
}

Assistant:

void SurfaceMesh::computeVertexNormals() {

  faceNormals.ensureHostBufferPopulated();
  faceAreas.ensureHostBufferPopulated();

  vertexNormals.data.resize(nVertices());

  const glm::vec3 zero{0., 0., 0.};

  std::fill(vertexNormals.data.begin(), vertexNormals.data.end(), zero);

  // Accumulate quantities from each face
  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t start = faceIndsStart[iF];
    size_t D = faceIndsStart[iF + 1] - start;
    for (size_t j = 0; j < D; j++) {
      size_t iV = faceIndsEntries[start + j];
      vertexNormals.data[iV] += faceNormals.data[iF] * static_cast<float>(faceAreas.data[iF]);
    }
  }

  // Normalize
  for (size_t iV = 0; iV < nVertices(); iV++) {
    vertexNormals.data[iV] = glm::normalize(vertexNormals.data[iV]);
  }

  vertexNormals.markHostBufferUpdated();
}